

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_parser.cpp
# Opt level: O0

spirv_cross * __thiscall
spirv_cross::extract_string_abi_cxx11_
          (spirv_cross *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *spirv,
          uint32_t offset)

{
  size_type sVar1;
  const_reference pvVar2;
  CompilerError *this_00;
  uint local_2c;
  value_type vStack_28;
  char c;
  uint32_t j;
  uint32_t w;
  uint32_t i;
  uint32_t offset_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *spirv_local;
  string *ret;
  
  ::std::__cxx11::string::string((string *)this);
  j = offset;
  do {
    sVar1 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)spirv);
    if (sVar1 <= j) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"String was not terminated before EOF");
      __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    pvVar2 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)spirv,(ulong)j);
    vStack_28 = *pvVar2;
    for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
      if ((char)vStack_28 == '\0') {
        return this;
      }
      ::std::__cxx11::string::operator+=((string *)this,(char)vStack_28);
      vStack_28 = vStack_28 >> 8;
    }
    j = j + 1;
  } while( true );
}

Assistant:

static string extract_string(const vector<uint32_t> &spirv, uint32_t offset)
{
	string ret;
	for (uint32_t i = offset; i < spirv.size(); i++)
	{
		uint32_t w = spirv[i];

		for (uint32_t j = 0; j < 4; j++, w >>= 8)
		{
			char c = w & 0xff;
			if (c == '\0')
				return ret;
			ret += c;
		}
	}

	SPIRV_CROSS_THROW("String was not terminated before EOF");
}